

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall
args::PositionalList<int,_args::detail::vector,_args::ValueReader>::ParseValue
          (PositionalList<int,_args::detail::vector,_args::ValueReader> *this,string *value_)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  const_iterator local_28;
  int local_1c;
  string *psStack_18;
  int v;
  string *value__local;
  PositionalList<int,_args::detail::vector,_args::ValueReader> *this_local;
  
  psStack_18 = value_;
  value__local = (string *)this;
  ValueReader::operator()
            ((ValueReader *)&this->field_0xd0,&(this->super_PositionalBase).super_NamedBase.name,
             value_,&local_1c);
  local_30._M_current = (int *)std::end<std::vector<int,std::allocator<int>>>(&this->values);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_28,
             &local_30);
  std::vector<int,_std::allocator<int>_>::insert(&this->values,local_28,&local_1c);
  (this->super_PositionalBase).super_NamedBase.super_Base.matched = true;
  return;
}

Assistant:

virtual void ParseValue(const std::string &value_) override
            {
                T v;
#ifdef ARGS_NOEXCEPT
                if (!reader(name, value_, v))
                {
                    error = Error::Parse;
                }
#else
                reader(name, value_, v);
#endif
                values.insert(std::end(values), v);
                matched = true;
            }